

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

void __thiscall features::Sift::process(Sift *this)

{
  ostream *poVar1;
  size_t sVar2;
  size_type sVar3;
  reference pvVar4;
  ulong local_28;
  size_t i;
  ClockTimer total_timer;
  ClockTimer timer;
  Sift *this_local;
  
  util::ClockTimer::ClockTimer(&total_timer);
  util::ClockTimer::ClockTimer((ClockTimer *)&i);
  if (((this->options).verbose_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SIFT: Creating ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(this->options).max_octave - (this->options).min_octave);
    poVar1 = std::operator<<(poVar1," octaves (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->options).min_octave);
    poVar1 = std::operator<<(poVar1," to ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->options).max_octave);
    poVar1 = std::operator<<(poVar1,")...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  util::ClockTimer::reset(&total_timer);
  create_octaves(this);
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SIFT: Creating octaves took ");
    sVar2 = util::ClockTimer::get_elapsed(&total_timer);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1,"ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SIFT: Detecting local extrema...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  util::ClockTimer::reset(&total_timer);
  extrema_detection(this);
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SIFT: Detected ");
    sVar3 = std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::size
                      (&this->keypoints);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
    poVar1 = std::operator<<(poVar1," keypoints, took ");
    sVar2 = util::ClockTimer::get_elapsed(&total_timer);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1,"ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SIFT: Localizing and filtering keypoints...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  util::ClockTimer::reset(&total_timer);
  keypoint_localization(this);
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SIFT: Retained ");
    sVar3 = std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::size
                      (&this->keypoints);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
    poVar1 = std::operator<<(poVar1," stable ");
    poVar1 = std::operator<<(poVar1,"keypoints, took ");
    sVar2 = util::ClockTimer::get_elapsed(&total_timer);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1,"ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_28 = 0;
  while( true ) {
    sVar3 = std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::size
                      (&this->octaves);
    if (sVar3 <= local_28) break;
    pvVar4 = std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::
             operator[](&this->octaves,local_28);
    std::
    vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
    ::clear(&pvVar4->dog);
    local_28 = local_28 + 1;
  }
  if (((this->options).verbose_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SIFT: Generating keypoint descriptors...");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  util::ClockTimer::reset(&total_timer);
  descriptor_generation(this);
  if (((this->options).debug_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SIFT: Generated ");
    sVar3 = std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
            size(&this->descriptors);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
    poVar1 = std::operator<<(poVar1," descriptors, took ");
    sVar2 = util::ClockTimer::get_elapsed(&total_timer);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1,"ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (((this->options).verbose_output & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"SIFT: Generated ");
    sVar3 = std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
            size(&this->descriptors);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
    poVar1 = std::operator<<(poVar1," descriptors from ");
    sVar3 = std::vector<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>::size
                      (&this->keypoints);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar3);
    poVar1 = std::operator<<(poVar1," keypoints,");
    poVar1 = std::operator<<(poVar1," took ");
    sVar2 = util::ClockTimer::get_elapsed((ClockTimer *)&i);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2);
    poVar1 = std::operator<<(poVar1,"ms.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::vector<features::Sift::Octave,_std::allocator<features::Sift::Octave>_>::clear
            (&this->octaves);
  return;
}

Assistant:

void
Sift::process (void)
{
    util::ClockTimer timer, total_timer;

    /*
     * Creates the scale space representation of the image by
     * sampling the scale space and computing the DoG images.
     * See Section 3, 3.2 and 3.3 in SIFT article.
     */
    if (this->options.verbose_output)
    {
        std::cout << "SIFT: Creating "
            << (this->options.max_octave - this->options.min_octave)
            << " octaves (" << this->options.min_octave << " to "
            << this->options.max_octave << ")..." << std::endl;
    }
    timer.reset();
    this->create_octaves();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Creating octaves took "
            << timer.get_elapsed() << "ms." << std::endl;
    }

    /*
     * Detects local extrema in the DoG function as described in Section 3.1.
     */
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Detecting local extrema..." << std::endl;
    }
    timer.reset();
    this->extrema_detection();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Detected " << this->keypoints.size()
            << " keypoints, took " << timer.get_elapsed() << "ms." << std::endl;
    }

    /*
     * Accurate keypoint localization and filtering.
     * According to Section 4 in SIFT article.
     */
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Localizing and filtering keypoints..." << std::endl;
    }
    timer.reset();
    this->keypoint_localization();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Retained " << this->keypoints.size() << " stable "
            << "keypoints, took " << timer.get_elapsed() << "ms." << std::endl;
    }

    /*
     * Difference of Gaussian images are not needed anymore.
     */
    for (std::size_t i = 0; i < this->octaves.size(); ++i)
        this->octaves[i].dog.clear();

    /*
     * Generate the list of keypoint descriptors.
     * See Section 5 and 6 in the SIFT article.
     * This list can in general be larger than the amount of keypoints,
     * since for each keypoint several descriptors may be created.
     */
    if (this->options.verbose_output)
    {
        std::cout << "SIFT: Generating keypoint descriptors..." << std::endl;
    }
    timer.reset();
    this->descriptor_generation();
    if (this->options.debug_output)
    {
        std::cout << "SIFT: Generated " << this->descriptors.size()
            << " descriptors, took " << timer.get_elapsed() << "ms."
            << std::endl;
    }
    if (this->options.verbose_output)
    {
        std::cout << "SIFT: Generated " << this->descriptors.size()
            << " descriptors from " << this->keypoints.size() << " keypoints,"
            << " took " << total_timer.get_elapsed() << "ms." << std::endl;
    }

    /* Free memory. */
    this->octaves.clear();
}